

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pool.cpp
# Opt level: O0

void __thiscall cppcms::session_pool::session_pool(session_pool *this,value *v)

{
  _data *v_00;
  cached_settings *this_00;
  cached_settings *p;
  value *in_RSI;
  noncopyable *in_RDI;
  noncopyable *this_01;
  value *in_stack_ffffffffffffff88;
  unique_ptr<cppcms::session_api_factory,_std::default_delete<cppcms::session_api_factory>_>
  *in_stack_ffffffffffffff90;
  _data *in_stack_ffffffffffffffb0;
  
  booster::noncopyable::noncopyable(in_RDI);
  v_00 = (_data *)operator_new(0x18);
  *(undefined8 *)v_00 = 0;
  (v_00->settings).d.d.ptr_ = (_data *)0x0;
  (v_00->cached_settings).ptr_ = (cached_settings *)0x0;
  _data::_data(in_stack_ffffffffffffffb0);
  booster::hold_ptr<cppcms::session_pool::_data>::hold_ptr
            ((hold_ptr<cppcms::session_pool::_data> *)in_RDI,v_00);
  this_01 = in_RDI + 8;
  std::unique_ptr<cppcms::session_api_factory,std::default_delete<cppcms::session_api_factory>>::
  unique_ptr<std::default_delete<cppcms::session_api_factory>,void>(in_stack_ffffffffffffff90);
  std::
  unique_ptr<cppcms::sessions::encryptor_factory,std::default_delete<cppcms::sessions::encryptor_factory>>
  ::unique_ptr<std::default_delete<cppcms::sessions::encryptor_factory>,void>
            ((unique_ptr<cppcms::sessions::encryptor_factory,_std::default_delete<cppcms::sessions::encryptor_factory>_>
              *)in_stack_ffffffffffffff90);
  std::
  unique_ptr<cppcms::sessions::session_storage_factory,std::default_delete<cppcms::sessions::session_storage_factory>>
  ::unique_ptr<std::default_delete<cppcms::sessions::session_storage_factory>,void>
            ((unique_ptr<cppcms::sessions::session_storage_factory,_std::default_delete<cppcms::sessions::session_storage_factory>_>
              *)in_stack_ffffffffffffff90);
  *(undefined8 *)(in_RDI + 0x20) = 0;
  this_00 = (cached_settings *)
            booster::hold_ptr<cppcms::session_pool::_data>::operator->
                      ((hold_ptr<cppcms::session_pool::_data> *)in_RDI);
  json::value::operator=((value *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  p = (cached_settings *)
      booster::hold_ptr<cppcms::session_pool::_data>::operator->
                ((hold_ptr<cppcms::session_pool::_data> *)in_RDI);
  operator_new(0x180);
  impl::cached_settings::cached_settings(this_00,in_RSI);
  booster::hold_ptr<cppcms::impl::cached_settings>::reset
            ((hold_ptr<cppcms::impl::cached_settings> *)this_01,p);
  return;
}

Assistant:

session_pool::session_pool(cppcms::json::value const &v) :
	d(new _data()),
	service_(0)
{
	d->settings = v;
	d->cached_settings.reset(new cppcms::impl::cached_settings(v));
}